

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddBuildTargetRule(cmLocalGenerator *this,string *llang,cmGeneratorTarget *target)

{
  pointer *this_00;
  cmMakefile *pcVar1;
  cmTarget *pcVar2;
  cmSourceFile *pcVar3;
  bool bVar4;
  char *pcVar5;
  reference ppcVar6;
  cmCustomCommand *pcVar7;
  ulong uVar8;
  reference s;
  iterator __first;
  iterator __last;
  char *workingDir;
  undefined1 auVar9 [16];
  byte local_641;
  allocator local_601;
  string local_600;
  string local_5e0;
  allocator local_5b9;
  string local_5b8 [8];
  string comment;
  string local_590;
  undefined1 local_570 [8];
  string targetFullPath;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_538;
  const_iterator local_530;
  undefined1 local_528 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  cmCustomCommandLine commandLine;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4f0;
  iterator i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  value_type local_4c8;
  undefined1 local_4a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rules;
  cmCustomCommandLines commandLines;
  string local_470;
  allocator local_449;
  string local_448;
  undefined1 local_428 [8];
  string langFlags;
  RuleVariables vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2f0 [8];
  string linkFlags;
  string flags;
  string linkPath;
  string frameworkPath;
  string linkLibs;
  string local_248;
  undefined1 local_228 [8];
  string targetName;
  undefined1 local_1e0 [7];
  bool useWatcomQuote;
  string createRule;
  allocator local_199;
  undefined1 local_198 [8];
  string ofname;
  string obj;
  string dir_max;
  string local_130;
  byte local_10b;
  byte local_10a;
  allocator local_109;
  string local_108;
  cmSourceFile *local_e8;
  cmSourceFile *sf;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_d8;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_d0;
  const_iterator i;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> classes;
  allocator local_99;
  string local_98;
  undefined1 local_78 [8];
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objVector;
  string objs;
  cmGeneratorTarget *target_local;
  string *llang_local;
  cmLocalGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &objVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&config.field_2 + 8));
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"CMAKE_BUILD_TYPE",&local_99);
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_78,pcVar5,
             (allocator *)
             ((long)&classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&classes.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i);
  cmGeneratorTarget::GetSourceFiles
            (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i,(string *)local_78
            );
  local_d8._M_current =
       (cmSourceFile **)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i);
  __gnu_cxx::
  __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>::
  __normal_iterator<cmSourceFile**>
            ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
              *)&local_d0,&local_d8);
  while( true ) {
    sf = (cmSourceFile *)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i);
    bVar4 = __gnu_cxx::operator!=
                      (&local_d0,
                       (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                        *)&sf);
    if (!bVar4) break;
    ppcVar6 = __gnu_cxx::
              __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&local_d0);
    local_e8 = *ppcVar6;
    local_10a = 0;
    local_10b = 0;
    dir_max.field_2._M_local_buf[0xe] = '\0';
    dir_max.field_2._M_local_buf[0xd] = '\0';
    pcVar7 = cmSourceFile::GetCustomCommand(local_e8);
    pcVar3 = local_e8;
    local_641 = 0;
    if (pcVar7 == (cmCustomCommand *)0x0) {
      std::allocator<char>::allocator();
      local_10a = 1;
      std::__cxx11::string::string((string *)&local_108,"HEADER_FILE_ONLY",&local_109);
      local_10b = 1;
      bVar4 = cmSourceFile::GetPropertyAsBool(pcVar3,&local_108);
      pcVar3 = local_e8;
      local_641 = 0;
      if (!bVar4) {
        std::allocator<char>::allocator();
        dir_max.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string
                  ((string *)&local_130,"EXTERNAL_OBJECT",
                   (allocator *)(dir_max.field_2._M_local_buf + 0xf));
        dir_max.field_2._M_local_buf[0xd] = '\x01';
        bVar4 = cmSourceFile::GetPropertyAsBool(pcVar3,&local_130);
        local_641 = bVar4 ^ 0xff;
      }
    }
    if ((dir_max.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_130);
    }
    if ((dir_max.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(dir_max.field_2._M_local_buf + 0xf));
    }
    if ((local_10b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_108);
    }
    if ((local_10a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    if ((local_641 & 1) != 0) {
      std::__cxx11::string::string((string *)(obj.field_2._M_local_buf + 8));
      pcVar5 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
      std::__cxx11::string::operator+=((string *)(obj.field_2._M_local_buf + 8),pcVar5);
      std::__cxx11::string::operator+=((string *)(obj.field_2._M_local_buf + 8),"/");
      GetObjectFileNameWithoutTarget
                ((string *)((long)&ofname.field_2 + 8),this,local_e8,
                 (string *)((long)&obj.field_2 + 8),(bool *)0x0);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pcVar5 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_198,pcVar5,&local_199);
        std::allocator<char>::~allocator((allocator<char> *)&local_199);
        std::__cxx11::string::operator+=((string *)local_198,"/");
        std::__cxx11::string::operator+=
                  ((string *)local_198,(string *)(ofname.field_2._M_local_buf + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&config.field_2 + 8),(value_type *)local_198);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&local_d0);
        AddCustomCommandToCreateObject(this,pcVar5,llang,*ppcVar6,target);
        cmOutputConverter::Convert
                  ((string *)((long)&createRule.field_2 + 8),&this->super_cmOutputConverter,
                   (string *)local_198,START_OUTPUT,SHELL);
        std::__cxx11::string::operator+=
                  ((string *)
                   &objVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (string *)(createRule.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(createRule.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=
                  ((string *)
                   &objVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
        std::__cxx11::string::~string((string *)local_198);
      }
      std::__cxx11::string::~string((string *)(ofname.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(obj.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&local_d0);
  }
  cmGeneratorTarget::GetCreateRuleVariable((string *)local_1e0,target,llang,(string *)local_78);
  pcVar1 = this->Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetName.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                 "_USE_WATCOM_QUOTE");
  bVar4 = cmMakefile::IsOn(pcVar1,(string *)((long)&targetName.field_2 + 8));
  std::__cxx11::string::~string((string *)(targetName.field_2._M_local_buf + 8));
  pcVar2 = target->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_248,"",(allocator *)(linkLibs.field_2._M_local_buf + 0xf));
  cmTarget::GetFullName((string *)local_228,pcVar2,&local_248,false);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)(linkLibs.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(flags.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_2f0);
  GetTargetFlags(this,(string *)(frameworkPath.field_2._M_local_buf + 8),
                 (string *)(linkPath.field_2._M_local_buf + 8),
                 (string *)(flags.field_2._M_local_buf + 8),
                 (string *)(linkFlags.field_2._M_local_buf + 8),(string *)local_2f0,target,bVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vars.FilterPrefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&flags.field_2 + 8));
  std::operator+(&local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vars.FilterPrefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&frameworkPath.field_2 + 8));
  std::__cxx11::string::operator=
            ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&vars.FilterPrefix);
  RuleVariables::RuleVariables((RuleVariables *)((long)&langFlags.field_2 + 8));
  vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
  vars.Language = (char *)std::__cxx11::string::c_str();
  vars.Object = ".";
  vars.Objects = (char *)std::__cxx11::string::c_str();
  vars.Target = (char *)std::__cxx11::string::c_str();
  vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)local_428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"",&local_449);
  AddLanguageFlags(this,(string *)local_428,llang,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_470,"",
             (allocator *)
             ((long)&commandLines.
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  AddArchitectureFlags(this,(string *)local_428,target,llang,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&commandLines.
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  vars.LinkFlags = (char *)std::__cxx11::string::c_str();
  cmCustomCommandLines::cmCustomCommandLines
            ((cmCustomCommandLines *)
             &rules.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4a8);
  pcVar5 = cmMakefile::GetRequiredDefinition(this->Makefile,(string *)local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4c8,pcVar5,
             (allocator *)
             ((long)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4a8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i_1);
  cmSystemTools::ExpandList
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i_1);
  local_4f0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_1);
  while( true ) {
    commandLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&i_1);
    bVar4 = __gnu_cxx::operator!=
                      (&local_4f0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&commandLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar4) break;
    s = __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_4f0);
    ExpandRuleVariables(this,s,(RuleVariables *)((long)&langFlags.field_2 + 8));
    cmCustomCommandLine::cmCustomCommandLine
              ((cmCustomCommandLine *)
               &cmd.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_4f0);
    auVar9 = std::__cxx11::string::c_str();
    cmSystemTools::ParseArguments_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_528,auVar9._0_8_,auVar9._8_8_);
    this_00 = &cmd.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_538._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_530,&local_538);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_528);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_528);
    targetFullPath.field_2._8_8_ =
         std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
         insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                   ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                    local_530,
                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )__first._M_current,
                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )__last._M_current);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
               &rules.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               &cmd.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_528);
    cmCustomCommandLine::~cmCustomCommandLine
              ((cmCustomCommandLine *)
               &cmd.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_4f0);
  }
  pcVar2 = target->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_590,"",(allocator *)(comment.field_2._M_local_buf + 0xf));
  cmTarget::GetFullPath((string *)local_570,pcVar2,&local_590,false,false);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)(comment.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"Linking ",&local_5b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::operator+=(local_5b8,(string *)llang);
  std::__cxx11::string::operator+=(local_5b8," target ");
  cmOutputConverter::Convert
            (&local_5e0,&this->super_cmOutputConverter,(string *)local_570,START_OUTPUT,UNCHANGED);
  std::__cxx11::string::operator+=(local_5b8,(string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"",&local_601);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  workingDir = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  cmMakefile::AddCustomCommandToOutput
            (pcVar1,(string *)local_570,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&config.field_2 + 8),&local_600,
             (cmCustomCommandLines *)
             &rules.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar5,workingDir,false,true,false)
  ;
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  cmMakefile::GetSource(this->Makefile,(string *)local_570);
  cmTarget::AddSource(target->Target,(string *)local_570);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string((string *)local_570);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4a8);
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)
             &rules.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_428);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)local_1e0);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i);
  std::__cxx11::string::~string((string *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &objVector.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmLocalGenerator::AddBuildTargetRule(const std::string& llang,
                                          cmGeneratorTarget& target)
{
  std::string objs;
  std::vector<std::string> objVector;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  // Add all the sources outputs to the depends of the target
  std::vector<cmSourceFile*> classes;
  target.GetSourceFiles(classes, config);
  for(std::vector<cmSourceFile*>::const_iterator i = classes.begin();
      i != classes.end(); ++i)
    {
    cmSourceFile* sf = *i;
    if(!sf->GetCustomCommand() &&
       !sf->GetPropertyAsBool("HEADER_FILE_ONLY") &&
       !sf->GetPropertyAsBool("EXTERNAL_OBJECT"))
      {
      std::string dir_max;
      dir_max += this->StateSnapshot.GetCurrentBinaryDirectory();
      dir_max += "/";
      std::string obj = this->GetObjectFileNameWithoutTarget(*sf, dir_max);
      if(!obj.empty())
        {
        std::string ofname = this->StateSnapshot.GetCurrentBinaryDirectory();
        ofname += "/";
        ofname += obj;
        objVector.push_back(ofname);
        this->AddCustomCommandToCreateObject(ofname.c_str(),
                                             llang, *(*i), target);
        objs += this->Convert(ofname,START_OUTPUT,SHELL);
        objs += " ";
        }
      }
    }
  std::string createRule = target.GetCreateRuleVariable(llang, config);
  bool useWatcomQuote = this->Makefile->IsOn(createRule+"_USE_WATCOM_QUOTE");
  std::string targetName = target.Target->GetFullName();
  // Executable :
  // Shared Library:
  // Static Library:
  // Shared Module:
  std::string linkLibs; // should be set
  std::string frameworkPath;
  std::string linkPath;
  std::string flags; // should be set
  std::string linkFlags; // should be set
  this->GetTargetFlags(linkLibs, frameworkPath, linkPath, flags, linkFlags,
                       &target, useWatcomQuote);
  linkLibs = frameworkPath + linkPath + linkLibs;
  cmLocalGenerator::RuleVariables vars;
  vars.Language = llang.c_str();
  vars.Objects = objs.c_str();
  vars.ObjectDir = ".";
  vars.Target = targetName.c_str();
  vars.LinkLibraries = linkLibs.c_str();
  vars.Flags = flags.c_str();
  vars.LinkFlags = linkFlags.c_str();

  std::string langFlags;
  this->AddLanguageFlags(langFlags, llang, "");
  this->AddArchitectureFlags(langFlags, &target, llang, "");
  vars.LanguageCompileFlags = langFlags.c_str();

  cmCustomCommandLines commandLines;
  std::vector<std::string> rules;
  rules.push_back(this->Makefile->GetRequiredDefinition(createRule));
  std::vector<std::string> commands;
  cmSystemTools::ExpandList(rules, commands);
  for(std::vector<std::string>::iterator i = commands.begin();
      i != commands.end(); ++i)
    {
    // Expand the full command line string.
    this->ExpandRuleVariables(*i, vars);
    // Parse the string to get the custom command line.
    cmCustomCommandLine commandLine;
    std::vector<std::string> cmd = cmSystemTools::ParseArguments(i->c_str());
    commandLine.insert(commandLine.end(), cmd.begin(), cmd.end());

    // Store this command line.
    commandLines.push_back(commandLine);
    }
  std::string targetFullPath = target.Target->GetFullPath();
  // Generate a meaningful comment for the command.
  std::string comment = "Linking ";
  comment += llang;
  comment += " target ";
  comment += this->Convert(targetFullPath, START_OUTPUT);
  this->Makefile->AddCustomCommandToOutput(
    targetFullPath,
    objVector,
    "",
    commandLines,
    comment.c_str(),
    this->StateSnapshot.GetCurrentBinaryDirectory()
    );
  this->Makefile->GetSource(targetFullPath);
  target.Target->AddSource(targetFullPath);
}